

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaTableInfoBind<false>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  reference this_00;
  CatalogEntry *pCVar1;
  undefined8 *puVar2;
  QualifiedName qname;
  string local_98;
  QualifiedName local_78;
  
  PragmaShowHelper::GetSchema(return_types,names);
  this_00 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  Value::GetValue<std::__cxx11::string>(&local_98,this_00);
  QualifiedName::Parse(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  Binder::BindSchemaOrCatalog(context,&local_78.catalog,&local_78.schema);
  pCVar1 = Catalog::GetEntry(context,TABLE_ENTRY,&local_78.catalog,&local_78.schema,&local_78.name);
  puVar2 = (undefined8 *)operator_new(0x30);
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = &PTR__TableFunctionData_01988d98;
  puVar2[4] = pCVar1;
  *(undefined1 *)(puVar2 + 5) = 0;
  *(undefined8 **)this = puVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.schema._M_dataplus._M_p != &local_78.schema.field_2) {
    operator_delete(local_78.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.catalog._M_dataplus._M_p != &local_78.catalog.field_2) {
    operator_delete(local_78.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> PragmaTableInfoBind(ClientContext &context, TableFunctionBindInput &input,
                                                    vector<LogicalType> &return_types, vector<string> &names) {
	if (IS_PRAGMA_TABLE_INFO) {
		PragmaTableInfoHelper::GetSchema(return_types, names);
	} else {
		PragmaShowHelper::GetSchema(return_types, names);
	}

	auto qname = QualifiedName::Parse(input.inputs[0].GetValue<string>());

	// look up the table name in the catalog
	Binder::BindSchemaOrCatalog(context, qname.catalog, qname.schema);
	auto &entry = Catalog::GetEntry(context, CatalogType::TABLE_ENTRY, qname.catalog, qname.schema, qname.name);
	return make_uniq<PragmaTableFunctionData>(entry, IS_PRAGMA_TABLE_INFO);
}